

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

optional<const_ArgsManager::Command> * __thiscall
ArgsManager::GetCommand
          (optional<const_ArgsManager::Command> *__return_storage_ptr__,ArgsManager *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  value_type *__str;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  Command ret;
  unique_lock<std::recursive_mutex> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar2 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_owns = false;
  local_80._M_device = (mutex_type *)this;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::unique_lock<std::recursive_mutex>::lock(&local_80);
  __str = (this->m_command).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (__str == (this->m_command).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = false;
  }
  else {
    if (this->m_accept_any_command != true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_70,__str);
      __str = __str + 1;
    }
    for (; __str != (this->m_command).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; __str = __str + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_50,__str);
    }
    paVar1 = &(__return_storage_ptr__->
              super__Optional_base<const_ArgsManager::Command,_false,_false>)._M_payload.
              super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
              super__Optional_payload_base<const_ArgsManager::Command>._M_payload._M_value.command.
              field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&(__return_storage_ptr__->super__Optional_base<const_ArgsManager::Command,_false,_false>).
          _M_payload.super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
          super__Optional_payload_base<const_ArgsManager::Command>._M_payload = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<const_ArgsManager::Command,_false,_false>)._M_payload.
               super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
               super__Optional_payload_base<const_ArgsManager::Command>._M_payload._M_value.command.
               field_2 + 8) = local_70.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->super__Optional_base<const_ArgsManager::Command,_false,_false>).
        _M_payload.super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
        super__Optional_payload_base<const_ArgsManager::Command>._M_payload =
           local_70._M_dataplus._M_p;
      (__return_storage_ptr__->super__Optional_base<const_ArgsManager::Command,_false,_false>).
      _M_payload.super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
      super__Optional_payload_base<const_ArgsManager::Command>._M_payload._M_value.command.field_2.
      _M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->super__Optional_base<const_ArgsManager::Command,_false,_false>).
    _M_payload.super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
    super__Optional_payload_base<const_ArgsManager::Command>._M_payload._M_value.command.
    _M_string_length = local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    *(pointer *)
     &(__return_storage_ptr__->super__Optional_base<const_ArgsManager::Command,_false,_false>).
      _M_payload.super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
      super__Optional_payload_base<const_ArgsManager::Command>._M_payload._M_value.args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl = local_50.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<const_ArgsManager::Command,_false,_false>
             )._M_payload.super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
             super__Optional_payload_base<const_ArgsManager::Command>._M_payload._M_value.args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     + 8) = local_50.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<const_ArgsManager::Command,_false,_false>
             )._M_payload.super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
             super__Optional_payload_base<const_ArgsManager::Command>._M_payload._M_value.args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     + 0x10) = local_50.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar3 = true;
    local_70._M_dataplus._M_p = (pointer)paVar2;
  }
  (__return_storage_ptr__->super__Optional_base<const_ArgsManager::Command,_false,_false>).
  _M_payload.super__Optional_payload<const_ArgsManager::Command,_true,_false,_false>.
  super__Optional_payload_base<const_ArgsManager::Command>._M_engaged = bVar3;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<const ArgsManager::Command> ArgsManager::GetCommand() const
{
    Command ret;
    LOCK(cs_args);
    auto it = m_command.begin();
    if (it == m_command.end()) {
        // No command was passed
        return std::nullopt;
    }
    if (!m_accept_any_command) {
        // The registered command
        ret.command = *(it++);
    }
    while (it != m_command.end()) {
        // The unregistered command and args (if any)
        ret.args.push_back(*(it++));
    }
    return ret;
}